

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_removeInterfaceTypePublicAndPrivate_Test::
~Variable_removeInterfaceTypePublicAndPrivate_Test
          (Variable_removeInterfaceTypePublicAndPrivate_Test *this)

{
  Variable_removeInterfaceTypePublicAndPrivate_Test *this_local;
  
  ~Variable_removeInterfaceTypePublicAndPrivate_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, removeInterfaceTypePublicAndPrivate)
{
    const std::string eWithInterfaceType =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <variable interface=\"public_and_private\"/>\n"
        "  </component>\n"
        "</model>\n";
    const std::string eWithOutInterfaceType =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <variable/>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v = libcellml::Variable::create();
    v->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE);
    c->addVariable(v);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(eWithInterfaceType, a);

    v->removeInterfaceType();

    a = printer->printModel(m);
    EXPECT_EQ(eWithOutInterfaceType, a);
}